

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupConeSupp(Gia_Man_t *p,int iLit,Vec_Int_t *vCiIds)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vObjs_00;
  Gia_Man_t *p_00;
  char *pcVar3;
  bool bVar4;
  Vec_Int_t *vObjs;
  Gia_Obj_t *pRoot;
  Gia_Obj_t *pObj;
  int iLit0;
  int i;
  Gia_Man_t *pNew;
  Vec_Int_t *vCiIds_local;
  int iLit_local;
  Gia_Man_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = Gia_ManObj(p,iVar1);
  vObjs_00 = Vec_IntAlloc(1000);
  iVar1 = Vec_IntSize(&p->vCopies);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 < iVar2) {
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFillExtra(&p->vCopies,iVar1,-1);
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCiIds);
    bVar4 = false;
    if (pObj._4_4_ < iVar1) {
      iVar1 = Vec_IntEntry(vCiIds,pObj._4_4_);
      pRoot = Gia_ManCi(p,iVar1);
      bVar4 = pRoot != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,pRoot);
    iVar2 = Gia_ManAppendCi(p_00);
    Gia_ObjSetCopyArray(p,iVar1,iVar2);
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  Gia_ManDupConeSupp_rec(p_00,p,pObj_00,vObjs_00);
  iVar1 = Abc_Lit2Var(iLit);
  iVar1 = Gia_ObjCopyArray(p,iVar1);
  iVar2 = Abc_LitIsCompl(iLit);
  iVar1 = Abc_LitNotCond(iVar1,iVar2);
  Gia_ManAppendCo(p_00,iVar1);
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCiIds);
    bVar4 = false;
    if (pObj._4_4_ < iVar1) {
      iVar1 = Vec_IntEntry(vCiIds,pObj._4_4_);
      pRoot = Gia_ManCi(p,iVar1);
      bVar4 = pRoot != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,pRoot);
    Gia_ObjSetCopyArray(p,iVar1,-1);
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjs_00);
    bVar4 = false;
    if (pObj._4_4_ < iVar1) {
      iVar1 = Vec_IntEntry(vObjs_00,pObj._4_4_);
      pRoot = Gia_ManObj(p,iVar1);
      bVar4 = pRoot != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,pRoot);
    Gia_ObjSetCopyArray(p,iVar1,-1);
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  Vec_IntFree(vObjs_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupConeSupp( Gia_Man_t * p, int iLit, Vec_Int_t * vCiIds )
{
    Gia_Man_t * pNew; int i, iLit0;
    Gia_Obj_t * pObj, * pRoot = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    Vec_Int_t * vObjs = Vec_IntAlloc( 1000 );
    //assert( Gia_ObjIsAnd(pRoot) );
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    Gia_ManDupConeSupp_rec( pNew, p, pRoot, vObjs );
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    Gia_ManAppendCo( pNew, iLit0 );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Vec_IntFree( vObjs );
    //assert( Vec_IntCountLarger(&p->vCopies, -1) == 0 );
    return pNew;
}